

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

void serialize_frames(ws_frame *frames,size_t num_frames)

{
  uint8_t *__dest;
  _Bool _Var1;
  cio_websocket_frame_type cVar2;
  frame_direction fVar3;
  void *__src;
  ulong __n;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint16_t len;
  uint8_t mask [4];
  byte local_54 [4];
  ulong local_50;
  size_t local_48;
  ulong local_40;
  ws_frame *local_38;
  
  if (num_frames == 0) {
    frame_buffer_fill_pos = 0xffffffff;
  }
  else {
    uVar8 = 0;
    sVar9 = 0;
    local_48 = num_frames;
    local_38 = frames;
    do {
      cVar2 = local_38[sVar9].frame_type;
      fVar3 = local_38[sVar9].direction;
      __src = local_38[sVar9].data;
      __n = local_38[sVar9].data_length;
      bVar6 = local_38[sVar9].last_frame << 7;
      _Var1 = local_38[sVar9].rsv;
      frame_buffer[uVar8] = bVar6;
      if ((_Var1 & 1U) != 0) {
        bVar6 = bVar6 | 0x70;
        frame_buffer[uVar8] = bVar6;
      }
      frame_buffer[uVar8] = (byte)cVar2 | bVar6;
      uVar7 = uVar8 + 1;
      bVar6 = (fVar3 == FROM_CLIENT) << 7;
      if (__n < 0x7e) {
        frame_buffer[uVar7] = bVar6 | (byte)__n;
        iVar12 = 2;
      }
      else if (__n < 0x10000) {
        frame_buffer[uVar7] = bVar6 | 0x7e;
        *(short *)(frame_buffer + (uVar8 + 2)) = (short)__n;
        iVar12 = 4;
      }
      else {
        frame_buffer[uVar7] = bVar6 | 0x7f;
        *(ulong *)(frame_buffer + (uVar8 + 2)) = __n;
        iVar12 = 10;
      }
      uVar7 = iVar12 + uVar8;
      local_54[0] = 1;
      local_54[1] = 2;
      local_54[2] = 3;
      local_54[3] = 4;
      if (fVar3 == FROM_CLIENT) {
        builtin_memcpy(frame_buffer + uVar7,"\x01\x02\x03\x04",4);
        uVar7 = uVar7 + 4;
        if (__n != 0) {
          local_40 = (ulong)uVar7;
          __dest = frame_buffer + local_40;
          memcpy(__dest,__src,__n);
          local_50 = 0;
          num_frames = local_48;
          if (__n < 8) {
            uVar4 = 0;
            do {
              __dest[uVar4] = __dest[uVar4] ^ local_54[(uint)uVar4 & 3];
              uVar4 = uVar4 + 1;
            } while (__n != uVar4);
          }
          else {
            uVar5 = (ulong)(-(int)__dest & 7);
            uVar4 = __n - uVar5;
            lVar10 = 0;
            do {
              *(byte *)((long)&local_50 + lVar10) = local_54[(int)lVar10 - (int)__dest & 3];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 8);
            if (uVar5 != 0) {
              lVar10 = 0;
              do {
                __dest[lVar10] = __dest[lVar10] ^ local_54[(uint)lVar10 & 3];
                lVar10 = lVar10 + 1;
              } while (((byte)(4 - ((char)uVar8 + (char)iVar12)) & 7) != (uint)lVar10);
            }
            if (7 < uVar4) {
              uVar11 = 0;
              do {
                *(ulong *)(__dest + uVar11 * 8 + uVar5) =
                     *(ulong *)(__dest + uVar11 * 8 + uVar5) ^ local_50;
                uVar11 = uVar11 + 1;
              } while (uVar4 >> 3 != uVar11);
            }
            uVar4 = (ulong)((uint)uVar4 & 7);
            if (__n - uVar4 < __n) {
              lVar10 = -uVar4;
              do {
                frame_buffer[local_40 + __n + lVar10] =
                     frame_buffer[local_40 + __n + lVar10] ^ local_54[(int)__n + (int)lVar10 & 3];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 0);
            }
          }
          goto LAB_0010c504;
        }
      }
      else if (__n != 0) {
        memcpy(frame_buffer + uVar7,__src,__n);
LAB_0010c504:
        uVar7 = (int)__n + uVar7;
      }
      uVar8 = uVar7;
      sVar9 = sVar9 + 1;
    } while (sVar9 != num_frames);
    frame_buffer_fill_pos = (size_t)(uVar8 - 1);
  }
  return;
}

Assistant:

static void serialize_frames(struct ws_frame frames[], size_t num_frames)
{
	uint32_t buffer_pos = 0;
	for (size_t i = 0; i < num_frames; i++) {
		struct ws_frame frame = frames[i];
		if (frame.last_frame) {
			frame_buffer[buffer_pos] = WS_HEADER_FIN;
		} else {
			frame_buffer[buffer_pos] = 0x0;
		}

		if (frame.rsv) {
			frame_buffer[buffer_pos] |= 0x70;
		}

		frame_buffer[buffer_pos] = (uint8_t)(frame_buffer[buffer_pos] | frame.frame_type);
		buffer_pos++;

		if (frame.direction == FROM_CLIENT) {
			frame_buffer[buffer_pos] = WS_MASK_SET;
		} else {
			frame_buffer[buffer_pos] = 0x00;
		}

		if (frame.data_length <= 125) {
			frame_buffer[buffer_pos] = (uint8_t)((unsigned int)frame_buffer[buffer_pos] | (unsigned int)frame.data_length);
			buffer_pos++;
		} else if (frame.data_length < 65536) {
			uint16_t len = (uint16_t)frame.data_length;
			frame_buffer[buffer_pos] |= 126;
			buffer_pos++;
			len = cio_htobe16(len);
			memcpy(&frame_buffer[buffer_pos], &len, sizeof(len));
			buffer_pos += (uint32_t)sizeof(len);
		} else {
			frame_buffer[buffer_pos] |= 127;
			buffer_pos++;
			uint64_t len = (uint64_t)frame.data_length;
			len = cio_htobe64(len);
			memcpy(&frame_buffer[buffer_pos], &len, sizeof(len));
			buffer_pos += (uint32_t)sizeof(len);
		}

		uint8_t mask[4] = {0x1, 0x2, 0x3, 0x4};
		if (frame.direction == FROM_CLIENT) {
			memcpy(&frame_buffer[buffer_pos], mask, sizeof(mask));
			buffer_pos += (uint32_t)sizeof(mask);
		}

		if (frame.data_length > 0) {
			memcpy(&frame_buffer[buffer_pos], frame.data, frame.data_length);
			if (frame.direction == FROM_CLIENT) {
				cio_websocket_mask(&frame_buffer[buffer_pos], frame.data_length, mask);
			}

			buffer_pos += (uint32_t)frame.data_length;
		}
	}

	frame_buffer_fill_pos = buffer_pos - 1;
}